

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

void __thiscall
LexerTest_ClassifyInt_Test::~LexerTest_ClassifyInt_Test(LexerTest_ClassifyInt_Test *this)

{
  LexerTest_ClassifyInt_Test *this_local;
  
  ~LexerTest_ClassifyInt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LexerTest, ClassifyInt) {
  ASSERT_FALSE(Lexer("0"sv).empty());
  ASSERT_TRUE(Lexer("0"sv).takeU64());
  ASSERT_TRUE(Lexer("0"sv).takeI64());
  ASSERT_TRUE(Lexer("0"sv).takeU32());
  ASSERT_TRUE(Lexer("0"sv).takeI32());
  ASSERT_TRUE(Lexer("0"sv).takeF64());
  ASSERT_TRUE(Lexer("0"sv).takeF32());
  EXPECT_EQ(*Lexer("0"sv).takeU64(), 0ull);
  EXPECT_EQ(*Lexer("0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("0"sv).takeU32(), 0u);
  EXPECT_EQ(*Lexer("0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("0"sv).takeF64(), 0.0);
  EXPECT_EQ(*Lexer("0"sv).takeF32(), 0.0);
  EXPECT_FALSE(std::signbit(*Lexer("0"sv).takeF64()));
  EXPECT_FALSE(std::signbit(*Lexer("0"sv).takeF32()));

  ASSERT_FALSE(Lexer("+0"sv).empty());
  EXPECT_FALSE(Lexer("+0"sv).takeU64());
  ASSERT_TRUE(Lexer("+0"sv).takeI64());
  EXPECT_FALSE(Lexer("+0"sv).takeU32());
  ASSERT_TRUE(Lexer("+0"sv).takeI32());
  ASSERT_TRUE(Lexer("+0"sv).takeF64());
  ASSERT_TRUE(Lexer("+0"sv).takeF32());
  EXPECT_EQ(*Lexer("+0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("+0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("+0"sv).takeF64(), 0.0);
  EXPECT_EQ(*Lexer("+0"sv).takeF32(), 0.0);
  EXPECT_FALSE(std::signbit(*Lexer("+0"sv).takeF64()));
  EXPECT_FALSE(std::signbit(*Lexer("+0"sv).takeF32()));

  ASSERT_FALSE(Lexer("-0"sv).empty());
  EXPECT_FALSE(Lexer("-0"sv).takeU64());
  ASSERT_TRUE(Lexer("-0"sv).takeI64());
  EXPECT_FALSE(Lexer("-0"sv).takeU32());
  ASSERT_TRUE(Lexer("-0"sv).takeI32());
  ASSERT_TRUE(Lexer("-0"sv).takeF64());
  ASSERT_TRUE(Lexer("-0"sv).takeF32());
  EXPECT_EQ(*Lexer("-0"sv).takeI64(), 0ull);
  EXPECT_EQ(*Lexer("-0"sv).takeI32(), 0u);
  EXPECT_EQ(*Lexer("-0"sv).takeF64(), -0.0);
  EXPECT_EQ(*Lexer("-0"sv).takeF32(), -0.0);
  ASSERT_TRUE(std::signbit(*Lexer("-0"sv).takeF64()));
  ASSERT_TRUE(std::signbit(*Lexer("-0"sv).takeF32()));

  ASSERT_FALSE(Lexer("0x7fff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeI64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0x7fff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeU64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeI64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeU32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeI32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeF64(), 0x7fffffff.p0);
  EXPECT_EQ(*Lexer("0x7fff_ffff"sv).takeF32(), 0x7fffffff.p0f);

  ASSERT_FALSE(Lexer("0x8000_0000"sv).empty());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeI64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeU32());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeU64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeI64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeU32(), 0x80000000u);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeI32(), 0x80000000u);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeF64(), 0x80000000.p0);
  EXPECT_EQ(*Lexer("0x8000_0000"sv).takeF32(), 0x80000000.p0f);

  ASSERT_FALSE(Lexer("+0x7fff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0x7fff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x7fff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeI64(), 0x7fffffffull);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeI32(), 0x7fffffffu);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeF64(), 0x7fffffff.p0);
  EXPECT_EQ(*Lexer("+0x7fff_ffff"sv).takeF32(), 0x7fffffff.p0f);

  ASSERT_FALSE(Lexer("+0x8000_0000"sv).empty());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeI64(), 0x80000000ull);
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeF64(), 0x80000000.p0);
  EXPECT_EQ(*Lexer("+0x8000_0000"sv).takeF32(), 0x80000000.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0000"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0000"sv).takeU32());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeI64(), -0x80000000ull);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeI32(), -0x80000000u);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeF64(), -0x80000000.p0);
  EXPECT_EQ(*Lexer("-0x8000_0000"sv).takeF32(), -0x80000000.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0001"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeU32());
  EXPECT_FALSE(Lexer("-0x8000_0001"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0001"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeI64(), -0x80000001ull);
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeF64(), -0x80000001.p0);
  EXPECT_EQ(*Lexer("-0x8000_0001"sv).takeF32(), -0x80000001.p0f);

  ASSERT_FALSE(Lexer("0xffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeI64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeU32());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0xffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeU64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeI64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeU32(), 0xffffffffu);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeI32(), 0xffffffffu);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeF64(), 0xffffffff.p0);
  EXPECT_EQ(*Lexer("0xffff_ffff"sv).takeF32(), 0xffffffff.p0f);

  ASSERT_FALSE(Lexer("0x1_0000_0000"sv).empty());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("0x1_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("0x1_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("0x1_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeU64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeI64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeF64(), 0x100000000.p0);
  EXPECT_EQ(*Lexer("0x1_0000_0000"sv).takeF32(), 0x100000000.p0f);

  ASSERT_FALSE(Lexer("+0xffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0xffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0xffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeI64(), 0xffffffffull);
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeF64(), 0xffffffff.p0);
  EXPECT_EQ(*Lexer("+0xffff_ffff"sv).takeF32(), 0xffffffff.p0f);

  ASSERT_FALSE(Lexer("+0x1_0000_0000"sv).empty());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x1_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x1_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeI64(), 0x100000000ull);
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeF64(), 0x100000000.p0);
  EXPECT_EQ(*Lexer("+0x1_0000_0000"sv).takeF32(), 0x100000000.p0f);

  ASSERT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0x7fff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeU64(), 0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeI64(), 0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeF64(), 0x7fffffffffffffff.p0);
  EXPECT_EQ(*Lexer("0x7fff_ffff_ffff_ffff"sv).takeF32(),
            0x7fffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeI64(),
            0x7fffffffffffffffull);
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF64(),
            0x7fffffffffffffff.p0);
  EXPECT_EQ(*Lexer("+0x7fff_ffff_ffff_ffff"sv).takeF32(),
            0x7fffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).empty());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeU64());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeI64());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeU32());
  EXPECT_FALSE(Lexer("-0x8000_0000_0000_0000"sv).takeI32());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeF64());
  ASSERT_TRUE(Lexer("-0x8000_0000_0000_0000"sv).takeF32());
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeI64(),
            -0x8000000000000000ull);
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeF64(),
            -0x8000000000000000.p0);
  EXPECT_EQ(*Lexer("-0x8000_0000_0000_0000"sv).takeF32(),
            -0x8000000000000000.p0f);

  ASSERT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).empty());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeU64());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("0xffff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("0xffff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeU64(), 0xffffffffffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeI64(), 0xffffffffffffffffull);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeF64(), 0xffffffffffffffff.p0);
  EXPECT_EQ(*Lexer("0xffff_ffff_ffff_ffff"sv).takeF32(),
            0xffffffffffffffff.p0f);

  ASSERT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).empty());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeU64());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeI64());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeU32());
  EXPECT_FALSE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeI32());
  ASSERT_TRUE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeF64());
  ASSERT_TRUE(Lexer("+0xffff_ffff_ffff_ffff"sv).takeF32());
  EXPECT_EQ(*Lexer("+0xffff_ffff_ffff_ffff"sv).takeF64(),
            0xffffffffffffffff.p0);
  EXPECT_EQ(*Lexer("+0xffff_ffff_ffff_ffff"sv).takeF32(),
            0xffffffffffffffff.p0f);
}